

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMesh.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChMesh::ComputeMassProperties
          (ChMesh *this,double *mass,ChVector<double> *com,ChMatrix33<double> *inertia)

{
  double dVar1;
  bool bVar2;
  __shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer psVar4;
  ulong uVar5;
  pointer psVar6;
  ulong uVar7;
  uint uVar8;
  pointer psVar9;
  pointer psVar10;
  
  *mass = 0.0;
  com->m_data[2] = 0.0;
  com->m_data[0] = 0.0;
  com->m_data[1] = 0.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  psVar6 = (this->vnodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar4 = (this->vnodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)psVar6 - (long)psVar4 >> 4;
  if (psVar6 != psVar4) {
    uVar8 = 1;
    psVar10 = psVar4;
    do {
      p_Var3 = &psVar10->super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>;
      psVar10 = psVar10 + 1;
      p_Var3->_M_ptr->m_TotalMass = 0.0;
      uVar7 = (ulong)uVar8;
      uVar8 = uVar8 + 1;
    } while (uVar7 < uVar5);
  }
  psVar9 = (this->velements).
           super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->velements).
      super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar9) {
    uVar5 = 0;
    uVar7 = 1;
    do {
      (*(psVar9[uVar5].super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_ChElementBase[8])();
      psVar9 = (this->velements).
               super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar7 < (ulong)((long)(this->velements).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4);
      uVar5 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar2);
    psVar6 = (this->vnodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar4 = (this->vnodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)psVar6 - (long)psVar4 >> 4;
  }
  if (psVar6 != psVar4) {
    dVar1 = *mass;
    uVar8 = 1;
    do {
      p_Var3 = &psVar4->super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>;
      psVar4 = psVar4 + 1;
      dVar1 = dVar1 + p_Var3->_M_ptr->m_TotalMass;
      uVar7 = (ulong)uVar8;
      uVar8 = uVar8 + 1;
      *mass = dVar1;
    } while (uVar7 < uVar5);
  }
  return;
}

Assistant:

void ChMesh::ComputeMassProperties(double& mass,           // ChMesh object mass
                                   ChVector<>& com,        // ChMesh center of gravity
                                   ChMatrix33<>& inertia)  // ChMesh inertia tensor
{
    mass = 0;
    com = ChVector<>(0);
    inertia = ChMatrix33<>(1);

    // Initialize all nodal total masses to zero
    for (unsigned int j = 0; j < vnodes.size(); j++) {
        vnodes[j]->m_TotalMass = 0.0;
    }
    // Loop over all elements and calculate contribution to nodal mass
    for (unsigned int ie = 0; ie < velements.size(); ie++) {
        velements[ie]->ComputeNodalMass();
    }
    // Loop over all the nodes of the mesh to obtain total object mass
    for (unsigned int j = 0; j < vnodes.size(); j++) {
        mass += vnodes[j]->m_TotalMass;
    }
}